

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ipc::ServiceProxy::ServiceProxy(ServiceProxy *this,EventListener *event_listener)

{
  EventListener *event_listener_local;
  ServiceProxy *this_local;
  
  this->_vptr_ServiceProxy = (_func_int **)&PTR__ServiceProxy_009c3968;
  perfetto::base::WeakPtr<perfetto::ipc::Client>::WeakPtr(&this->client_);
  this->service_id_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map(&this->remote_method_ids_);
  std::
  map<unsigned_long,_perfetto::ipc::DeferredBase,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_perfetto::ipc::DeferredBase>_>_>
  ::map(&this->pending_callbacks_);
  this->event_listener_ = event_listener;
  perfetto::base::WeakPtrFactory<perfetto::ipc::ServiceProxy>::WeakPtrFactory
            (&this->weak_ptr_factory_,this);
  return;
}

Assistant:

ServiceProxy::ServiceProxy(EventListener* event_listener)
    : event_listener_(event_listener), weak_ptr_factory_(this) {}